

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O0

void get_comm(char **pt,char *kcomm,unsigned_long *stat)

{
  char *__src;
  int iVar1;
  ushort **ppuVar2;
  char *local_38;
  char *p;
  int nchar;
  char *pi;
  unsigned_long *stat_local;
  char *kcomm_local;
  char **pt_local;
  
  __src = *pt;
  local_38 = __src;
  if (*__src != '/') {
    *stat = *stat | 0x400;
  }
  while (local_38 = local_38 + 1, *local_38 != '\0') {
    ppuVar2 = __ctype_b_loc();
    if (((*ppuVar2)[(int)*local_38] & 0x4000) == 0) {
      *stat = *stat | 0x800;
    }
  }
  iVar1 = (int)local_38 - (int)__src;
  strncpy(kcomm,__src,(long)iVar1);
  kcomm[iVar1] = '\0';
  return;
}

Assistant:

void get_comm(char **pt,     		/* card string */
	    char *kcomm,		/* comment string */
	    unsigned long *stat		/* error number */
	   )
{        
    char *pi;
    int nchar = 0;
    char *p; 

    p = *pt;
    pi = p;
    if(*p != '/')  { 
      *stat |= NO_START_SLASH; 
    }
    p++;
    while(*p != '\0') {
        if(!isprint((int)*p) ) *stat |=  BAD_COMMENT;
        p++;
    }
    nchar = p - pi; 
    strncpy(kcomm,pi,nchar);
    *(kcomm+nchar) = '\0';
    return;
}